

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

Box * __thiscall amrex::BoxArray::operator[](Box *__return_storage_ptr__,BoxArray *this,MFIter *mfi)

{
  BATransformer::operator()
            (__return_storage_ptr__,&this->m_bat,
             (Box *)((long)(mfi->index_map->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[mfi->currentIndex] * 0x1c +
                    *(long *)&(((this->m_ref).
                                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data));
  return __return_storage_ptr__;
}

Assistant:

Box
BoxArray::operator[] (const MFIter& mfi) const noexcept
{
    return (*this)[mfi.index()];
}